

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::PrintTriedExpectationsLocked
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,ArgumentTuple *args,ostream *why
          )

{
  TypedExpectation<unsigned_char_(unsigned_short)> *this_00;
  ostream *poVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  uVar4 = (ulong)((long)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                        super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_UntypedFunctionMockerBase).untyped_expectations_.
                       super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  poVar1 = std::operator<<(why,"Google Mock tried the following ");
  iVar3 = (int)uVar4;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
  poVar1 = std::operator<<(poVar1," ");
  pcVar2 = "expectations, but none matched";
  if (iVar3 == 1) {
    pcVar2 = "expectation, but it didn\'t match";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,":\n");
  lVar5 = 0;
  uVar6 = 0;
  if (0 < iVar3) {
    uVar6 = uVar4 & 0xffffffff;
  }
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    this_00 = *(TypedExpectation<unsigned_char_(unsigned_short)> **)
               ((long)&((this->super_UntypedFunctionMockerBase).untyped_expectations_.
                        super__Vector_base<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->value_ + lVar5);
    std::operator<<(why,"\n");
    ExpectationBase::DescribeLocationTo(&this_00->super_ExpectationBase,why);
    if (1 < iVar3) {
      poVar1 = std::operator<<(why,"tried expectation #");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar4);
      std::operator<<(poVar1,": ");
    }
    poVar1 = std::operator<<(why,(this_00->super_ExpectationBase).source_text_._M_dataplus._M_p);
    std::operator<<(poVar1,"...\n");
    TypedExpectation<unsigned_char_(unsigned_short)>::ExplainMatchResultTo(this_00,args,why);
    ExpectationBase::DescribeCallCountTo(&this_00->super_ExpectationBase,why);
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = static_cast<int>(untyped_expectations_.size());
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (int i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }